

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::SourceCodeInfo_Location::InternalSwap
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *other)

{
  InternalMetadata *this_00;
  uint32 uVar1;
  string *psVar2;
  ArenaStringPtr *pAVar3;
  UnknownFieldSet *other_00;
  ArenaStringPtr *pAVar4;
  Arena *pAVar5;
  
  this_00 = &(other->super_Message).super_MessageLite._internal_metadata_;
  if ((((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) ||
     (((ulong)this_00->ptr_ & 1) != 0)) {
    if (((ulong)this_00->ptr_ & 1) == 0) {
      other_00 = internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      other_00 = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  RepeatedField<int>::InternalSwap(&this->path_,&other->path_);
  RepeatedField<int>::InternalSwap(&this->span_,&other->span_);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,
             &(other->leading_detached_comments_).super_RepeatedPtrFieldBase);
  pAVar4 = &this->leading_comments_;
  pAVar5 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  pAVar3 = &other->leading_comments_;
  if (pAVar4->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar3->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_002acb6a;
    internal::ArenaStringPtr::CreateInstance
              (pAVar4,pAVar5,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar2 = pAVar4->ptr_;
  if (pAVar3->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar3,pAVar5,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar2);
LAB_002acb6a:
  pAVar5 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  pAVar4 = &this->trailing_comments_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  pAVar3 = &other->trailing_comments_;
  if (pAVar4->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar3->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      return;
    }
    internal::ArenaStringPtr::CreateInstance
              (pAVar4,pAVar5,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar2 = pAVar4->ptr_;
  if (pAVar3->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar3,pAVar5,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar2);
  return;
}

Assistant:

void SourceCodeInfo_Location::InternalSwap(SourceCodeInfo_Location* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  path_.InternalSwap(&other->path_);
  span_.InternalSwap(&other->span_);
  leading_detached_comments_.InternalSwap(&other->leading_detached_comments_);
  leading_comments_.Swap(&other->leading_comments_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  trailing_comments_.Swap(&other->trailing_comments_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
}